

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

void __thiscall
pbrt::SpectralFilm::SpectralFilm
          (SpectralFilm *this,FilmBaseParameters *p,Float lambdaMin,Float lambdaMax,int nBuckets,
          RGBColorSpace *colorSpace,Float maxComponentValue,bool writeFP16,Allocator alloc)

{
  Bounds2i extent;
  bool bVar1;
  int iVar2;
  Point2i p_00;
  undefined8 in_RCX;
  Float in_EDX;
  FilmBase *in_RSI;
  SquareMatrix<3> *in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  long in_FS_OFFSET;
  Float in_XMM0_Da;
  Float level;
  Float in_XMM1_Da;
  Float in_XMM2_Da;
  Bounds2iIterator BVar3;
  Pixel *pixel;
  Point2i p_1;
  Bounds2iIterator __end1;
  Bounds2iIterator __begin1;
  Bounds2i *__range1;
  AtomicDouble *splatBuffer;
  double *bucketWeightBuffer;
  int nPixels;
  FilmBaseParameters *in_stack_fffffffffffffe38;
  FilmBaseParameters *in_stack_fffffffffffffe40;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffe48;
  Allocator in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  char (*in_stack_fffffffffffffe80) [23];
  char *in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  FilmBaseParameters *in_stack_fffffffffffffea8;
  SquareMatrix<3> *m1;
  Bounds2iIterator local_100;
  Float *local_f0;
  AtomicDouble *local_e8;
  double *local_e0;
  int local_d8;
  undefined8 local_d4;
  undefined8 uStack_cc;
  undefined8 uStack_c4;
  undefined8 uStack_bc;
  Float local_b4;
  undefined8 local_b0;
  Tuple2<pbrt::Point2,_int> local_a8;
  Tuple2<pbrt::Point2,_int> TStack_a0;
  SquareMatrix<3> local_88 [2];
  byte local_35;
  Float local_34;
  undefined8 local_30;
  Float local_24;
  Float local_20;
  Float local_1c;
  undefined8 local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  local_35 = in_R8B & 1;
  m1 = local_88;
  local_34 = in_XMM2_Da;
  local_30 = in_RCX;
  local_24 = in_EDX;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  local_8 = in_R9;
  FilmBaseParameters::FilmBaseParameters(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  FilmBase::FilmBase(in_RSI,in_stack_fffffffffffffea8);
  FilmBaseParameters::~FilmBaseParameters((FilmBaseParameters *)0x8cd9c3);
  *(undefined8 *)(in_RDI[2].m[0] + 2) = local_30;
  in_RDI[2].m[1][1] = local_1c;
  in_RDI[2].m[1][2] = local_20;
  in_RDI[2].m[2][0] = local_24;
  in_RDI[2].m[2][1] = local_34;
  *(byte *)(in_RDI[2].m[2] + 2) = local_35 & 1;
  local_a8 = (in_RSI->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  TStack_a0 = (in_RSI->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  local_b0 = local_8;
  extent.pMax.super_Tuple2<pbrt::Point2,_int>._0_7_ = in_stack_fffffffffffffe60;
  extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffffe58;
  extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  extent.pMax.super_Tuple2<pbrt::Point2,_int>.y._3_1_ = in_stack_fffffffffffffe67;
  Array2D<pbrt::SpectralFilm::Pixel>::Array2D
            ((Array2D<pbrt::SpectralFilm::Pixel> *)in_stack_fffffffffffffe48,extent,
             in_stack_fffffffffffffe50);
  SquareMatrix<3>::SquareMatrix(in_RDI + 4);
  pbrt::operator*(m1,in_RDI);
  in_RDI[4].m[2][2] = local_b4;
  *(undefined8 *)in_RDI[4].m[0] = local_d4;
  *(undefined8 *)(in_RDI[4].m[0] + 2) = uStack_cc;
  *(undefined8 *)(in_RDI[4].m[1] + 1) = uStack_c4;
  *(undefined8 *)in_RDI[4].m[2] = uStack_bc;
  level = Filter::Integral((Filter *)in_stack_fffffffffffffe40);
  in_RDI[3].m[0][0] = level;
  bVar1 = Bounds2<int>::IsEmpty((Bounds2<int> *)(in_RDI->m[0] + 2));
  if (!bVar1) {
    iVar2 = Bounds2<int>::Area((Bounds2<int> *)in_stack_fffffffffffffe40);
    *(long *)(in_FS_OFFSET + -0x28) =
         *(long *)(in_FS_OFFSET + -0x28) + (long)iVar2 * ((long)((int)local_24 * 3) * 8 + 0x50);
    local_d8 = Bounds2<int>::Area((Bounds2<int> *)in_stack_fffffffffffffe40);
    local_e0 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<double>
                         ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe40,
                          (size_t)in_stack_fffffffffffffe38);
    memset(local_e0,0,(long)((int)local_24 * local_d8 * 2) << 3);
    local_e8 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::AtomicDouble>
                         ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffe40,
                          (size_t)in_stack_fffffffffffffe38);
    memset(local_e8,0,(long)((int)local_24 * local_d8) << 3);
    local_f0 = in_RDI->m[0] + 2;
    local_100 = pbrt::begin((Bounds2i *)0x8cdcdd);
    pbrt::end((Bounds2i *)in_stack_fffffffffffffe40);
    BVar3.bounds = (Bounds2i *)in_stack_fffffffffffffe40;
    BVar3.p.super_Tuple2<pbrt::Point2,_int> = in_stack_fffffffffffffe48;
    while( true ) {
      bVar1 = Bounds2iIterator::operator!=
                        ((Bounds2iIterator *)in_stack_fffffffffffffe50.memoryResource,
                         (Bounds2iIterator *)
                         BVar3.p.super_Tuple2<pbrt::Point2,_int>.super_Tuple2<pbrt::Point2,_int>);
      if (!bVar1) break;
      p_00 = Bounds2iIterator::operator*(&local_100);
      in_stack_fffffffffffffe50.memoryResource =
           (memory_resource *)
           Array2D<pbrt::SpectralFilm::Pixel>::operator[]
                     ((Array2D<pbrt::SpectralFilm::Pixel> *)(in_RDI[3].m[0] + 1),p_00);
      ((Pixel *)in_stack_fffffffffffffe50.memoryResource)->bucketSums = local_e0;
      ((Pixel *)in_stack_fffffffffffffe50.memoryResource)->weightSums = local_e0 + (int)local_24;
      local_e0 = local_e0 + (int)local_24 + (int)local_24;
      ((Pixel *)in_stack_fffffffffffffe50.memoryResource)->bucketSplats = local_e8;
      local_e8 = local_e8 + (int)local_24;
      BVar3 = Bounds2iIterator::operator++((Bounds2iIterator *)in_stack_fffffffffffffe38);
    }
    return;
  }
  LogFatal<char_const(&)[23]>
            ((LogLevel)level,(char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             iVar2,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
}

Assistant:

SpectralFilm::SpectralFilm(FilmBaseParameters p, Float lambdaMin, Float lambdaMax,
                           int nBuckets, const RGBColorSpace *colorSpace,
                           Float maxComponentValue, bool writeFP16, Allocator alloc)
    : FilmBase(p),
      colorSpace(colorSpace),
      lambdaMin(lambdaMin),
      lambdaMax(lambdaMax),
      nBuckets(nBuckets),
      maxComponentValue(maxComponentValue),
      writeFP16(writeFP16),
      pixels(p.pixelBounds, alloc) {
    // Compute _outputRGBFromSensorRGB_ matrix
    outputRGBFromSensorRGB = colorSpace->RGBFromXYZ * sensor->XYZFromSensorRGB;

    filterIntegral = filter.Integral();
    CHECK(!pixelBounds.IsEmpty());
    filmPixelMemory +=
        pixelBounds.Area() * (sizeof(Pixel) + 3 * nBuckets * sizeof(double));

    // Allocate memory for the pixel buffers in big arrays. Note that it's
    // wasteful (but convenient) to be storing three pointers in each
    // SpectralFilm::Pixel structure since the addresses could be computed
    // based on the base pointers and pixel coordinates.
    int nPixels = pixelBounds.Area();
    double *bucketWeightBuffer = alloc.allocate_object<double>(2 * nBuckets * nPixels);
    std::memset(bucketWeightBuffer, 0, 2 * nBuckets * nPixels * sizeof(double));
    AtomicDouble *splatBuffer = alloc.allocate_object<AtomicDouble>(nBuckets * nPixels);
    std::memset(splatBuffer, 0, nBuckets * nPixels * sizeof(double));

    for (Point2i p : pixelBounds) {
        Pixel &pixel = pixels[p];
        pixel.bucketSums = bucketWeightBuffer;
        bucketWeightBuffer += nBuckets;
        pixel.weightSums = bucketWeightBuffer;
        bucketWeightBuffer += nBuckets;
        pixel.bucketSplats = splatBuffer;
        splatBuffer += nBuckets;
    }
}